

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  size_t sVar1;
  VertexPacketAllocator *vpalloc_00;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> inputPrimitives;
  allocator_type local_49;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> local_48;
  
  vpalloc_00 = (VertexPacketAllocator *)numVertices;
  std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::vector
            (&local_48,numVertices,&local_49);
  if (numVertices != 0) {
    sVar1 = 0;
    do {
      local_48.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1].v0 = vertices[sVar1];
      sVar1 = sVar1 + 1;
    } while (numVertices != sVar1);
  }
  rr::(anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
            (&local_48,vpalloc);
  rr::(anonymous_namespace)::
  drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
            (state,renderTarget,program,&local_48,vpalloc_00);
  if (local_48.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}